

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

ze_image_flag_t to_flag(string *flag)

{
  long lVar1;
  ze_image_flag_t local_14;
  ze_image_flag_t image_flags;
  string *flag_local;
  
  lVar1 = std::__cxx11::string::find((char *)flag,0x1117c6);
  local_14 = (ze_image_flag_t)(lVar1 != -1);
  lVar1 = std::__cxx11::string::find((char *)flag,0x1117cc);
  if (lVar1 != -1) {
    local_14 = local_14 | ZE_IMAGE_FLAG_BIAS_UNCACHED;
  }
  return local_14;
}

Assistant:

ze_image_flag_t to_flag(const std::string flag) {

  // by default setting to READ
  ze_image_flag_t image_flags = {};

  // check if "READ" position is found in flag string
  if (flag.find("WRITE") != std::string::npos) {
    image_flags =
        static_cast<ze_image_flag_t>(image_flags | ZE_IMAGE_FLAG_KERNEL_WRITE);
  }
  if (flag.find("UNCACHED") != std::string::npos) {
    image_flags =
        static_cast<ze_image_flag_t>(image_flags | ZE_IMAGE_FLAG_BIAS_UNCACHED);
  }

  return image_flags;
}